

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t exr_set_lineorder(exr_context_t ctxt,int part_index,exr_lineorder_t lo)

{
  exr_result_t eVar1;
  uint in_EDX;
  int in_ESI;
  char *in_RDI;
  exr_priv_part_t part;
  int32_t in_stack_00000010;
  exr_result_t rv;
  exr_attribute_t *attr;
  exr_attribute_t **in_stack_00000040;
  exr_const_context_t in_stack_ffffffffffffffd0;
  exr_const_context_t c;
  int local_24;
  exr_result_t local_4;
  
  if (in_EDX < 3) {
    local_24 = 0;
    if (in_RDI == (char *)0x0) {
      local_4 = 2;
    }
    else {
      internal_exr_lock(in_stack_ffffffffffffffd0);
      if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
        internal_exr_unlock(in_stack_ffffffffffffffd0);
        local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
      }
      else {
        c = *(exr_const_context_t *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
        if (*in_RDI == '\0') {
          internal_exr_unlock(c);
          local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
        }
        else if (*in_RDI == '\x03') {
          internal_exr_unlock(c);
          local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
        }
        else {
          if (c->report_error == (_func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *)0x0
             ) {
            local_24 = exr_attr_list_add(ctxt,(exr_attribute_list_t *)CONCAT44(part_index,lo),
                                         (char *)attr,rv,in_stack_00000010,(uint8_t **)part,
                                         in_stack_00000040);
          }
          else if (*(int *)(c->report_error + 0x14) != 0xc) {
            internal_exr_unlock(c);
            eVar1 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,6,"Invalid required attribute type \'%s\' for \'%s\'",
                               *(undefined8 *)(c->report_error + 8),"lineOrder");
            return eVar1;
          }
          if (local_24 == 0) {
            c->report_error[0x18] = SUB41(in_EDX,0);
            *(uint *)((long)&c->output_file_offset + 4) = in_EDX;
          }
          internal_exr_unlock(c);
          local_4 = local_24;
        }
      }
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x48))
                        (in_RDI,4,"\'lineOrder\' value for line order (%d) out of range (%d - %d)",
                         in_EDX,0,3);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_set_lineorder (exr_context_t ctxt, int part_index, exr_lineorder_t lo)
{
    if (lo >= EXR_LINEORDER_LAST_TYPE)
        return ctxt->print_error (
            ctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "'lineOrder' value for line order (%d) out of range (%d - %d)",
            (int) lo,
            0,
            (int) EXR_LINEORDER_LAST_TYPE);

    {
        REQ_ATTR_FIND_CREATE (lineOrder, EXR_ATTR_LINEORDER);
        if (rv == EXR_ERR_SUCCESS)
        {
            attr->uc        = (uint8_t) lo;
            part->lineorder = lo;
        }

        return EXR_UNLOCK_AND_RETURN (rv);
    }
}